

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e8ba::CpuTest_jmp_Test::CpuTest_jmp_Test(CpuTest_jmp_Test *this)

{
  CpuTest_jmp_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_jmp_Test_003e7a50;
  return;
}

Assistant:

TEST_F(CpuTest, jmp) {
    stage_instruction(JMP);
    expected.pc = 0x1234;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));

    step_execution(3);

    EXPECT_EQ(expected, registers);
}